

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void array_suite::test_double_four(void)

{
  oarchive ar;
  double array [4];
  ostringstream result;
  string local_228 [32];
  basic_oarchive<char> local_208;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_208,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_198 = 3.5;
  dStack_190 = 4.5;
  local_1a8 = 1.5;
  dStack_1a0 = 2.5;
  trial::protocol::json::basic_oarchive<char>::save_override<double[4]>
            (&local_208,(double (*) [4])&local_1a8);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[70]>
            ("result.str()",
             "\"[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,300,"void array_suite::test_double_four()",local_228,
             "[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]");
  std::__cxx11::string::~string(local_228);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive(&local_208);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_double_four()
{
    std::ostringstream result;
    json::oarchive ar(result);
    double array[] = { 1.5, 2.5, 3.5, 4.5 };
    ar << array;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1.50000000000000,2.50000000000000,3.50000000000000,4.50000000000000]");
}